

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O0

int __thiscall cmXMLParser::CleanupParser(cmXMLParser *this)

{
  XML_Status XVar1;
  ostream *this_00;
  uint local_1c;
  int result;
  cmXMLParser *this_local;
  
  if (this->Parser == (void *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Parser not initialized");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this->ParseError = 1;
    this_local._4_4_ = 0;
  }
  else {
    local_1c = (uint)((this->ParseError != 0 ^ 0xffU) & 1);
    if ((local_1c != 0) &&
       (XVar1 = XML_Parse((XML_Parser)this->Parser,"",0,1), XVar1 == XML_STATUS_ERROR)) {
      (*this->_vptr_cmXMLParser[0xb])();
      local_1c = 0;
    }
    XML_ParserFree((XML_Parser)this->Parser);
    this->Parser = (void *)0x0;
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

int cmXMLParser::CleanupParser()
{
  if (!this->Parser) {
    std::cerr << "Parser not initialized" << std::endl;
    this->ParseError = 1;
    return 0;
  }
  int result = !this->ParseError;
  if (result) {
    // Tell the expat XML parser about the end-of-input.
    if (!XML_Parse(static_cast<XML_Parser>(this->Parser), "", 0, 1)) {
      this->ReportXmlParseError();
      result = 0;
    }
  }

  // Clean up the parser.
  XML_ParserFree(static_cast<XML_Parser>(this->Parser));
  this->Parser = nullptr;

  return result;
}